

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O3

uint32 rw::d3d8::makeFVFDeclaration(uint32 flags,int32 numTex)

{
  return (flags & 0x10) + (flags & 8) * 8 + numTex * 0x100 + 2;
}

Assistant:

uint32
makeFVFDeclaration(uint32 flags, int32 numTex)
{
	uint32 fvf = 0x2;
	if(flags & Geometry::NORMALS)
		fvf |= 0x10;
	if(flags & Geometry::PRELIT)
		fvf |= 0x40;
	fvf |= numTex << 8;
	return fvf;
}